

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.cpp
# Opt level: O0

void __thiscall
TPZDohrSubstructCondense<float>::Read
          (TPZDohrSubstructCondense<float> *this,TPZStream *input,void *context)

{
  TPZMatRed<float,_TPZFMatrix<float>_> *pTVar1;
  ostream *poVar2;
  void *this_00;
  long *in_RSI;
  TPZMatRed<float,_TPZFMatrix<float>_> *in_RDI;
  int control;
  pair<TPZDohrSubstructCondense<float>::ENumbering,_TPZDohrSubstructCondense<float>::ENumbering> p;
  ENumbering dest;
  ENumbering orig;
  int b;
  int a_1;
  int ic;
  int nc;
  int four;
  int three;
  int two;
  int one;
  int a;
  TPZVec<float> *in_stack_ffffffffffffff78;
  TPZStream *in_stack_ffffffffffffff80;
  void *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffffa0;
  ENumbering in_stack_ffffffffffffffa4;
  ENumbering local_54;
  ENumbering local_50;
  ENumbering local_4c;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar3;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 uVar4;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffd4;
  int local_1c [3];
  long *local_10;
  
  local_10 = in_RSI;
  (**(code **)(*in_RSI + 0xe8))(in_RSI,local_1c,1);
  if (local_1c[0] != 0) {
    in_stack_ffffffffffffff90 = operator_new(800);
    TPZMatRed<float,_TPZFMatrix<float>_>::TPZMatRed
              ((TPZMatRed<float,_TPZFMatrix<float>_> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    TPZAutoPointer<TPZMatRed<float,_TPZFMatrix<float>_>_>::operator=
              ((TPZAutoPointer<TPZMatRed<float,_TPZFMatrix<float>_>_> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_RDI);
    pTVar1 = TPZAutoPointer<TPZMatRed<float,_TPZFMatrix<float>_>_>::operator->
                       ((TPZAutoPointer<TPZMatRed<float,_TPZFMatrix<float>_>_> *)
                        &(in_RDI->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow);
    (*(pTVar1->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[6])
              (pTVar1,local_10,0);
  }
  (**(code **)(*local_10 + 0xe8))
            (local_10,&(in_RDI->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol,1);
  (**(code **)(*local_10 + 0xe8))
            (local_10,(undefined1 *)
                      ((long)&(in_RDI->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol + 4),1);
  (**(code **)(*local_10 + 0xe8))
            (local_10,&(in_RDI->super_TPZMatrix<float>).super_TPZBaseMatrix.fDecomposed,1);
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (&std::cout,(int)(in_RDI->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,*(int *)((long)&(in_RDI->super_TPZMatrix<float>).super_TPZBaseMatrix.
                                             fCol + 4));
  poVar2 = std::operator<<(poVar2," ");
  iVar3._0_1_ = (in_RDI->super_TPZMatrix<float>).super_TPZBaseMatrix.fDecomposed;
  iVar3._1_1_ = (in_RDI->super_TPZMatrix<float>).super_TPZBaseMatrix.fDefPositive;
  iVar3._2_2_ = *(undefined2 *)&(in_RDI->super_TPZMatrix<float>).super_TPZBaseMatrix.field_0x1a;
  this_00 = (void *)std::ostream::operator<<(poVar2,iVar3);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  TPZStream::Read<int>(in_stack_ffffffffffffff80,(TPZVec<int> *)in_stack_ffffffffffffff78);
  poVar2 = ::operator<<((ostream *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        (TPZVec<int> *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                       );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  uVar5 = 0xffffffff;
  local_34 = 0xfffffffe;
  local_38 = 0xfffffffd;
  uVar4 = 0xfffffffc;
  (**(code **)(*local_10 + 0xe8))(local_10,&stack0xffffffffffffffd0,1);
  TPZFMatrix<float>::Read
            ((TPZFMatrix<float> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (TPZStream *)in_RDI,in_stack_ffffffffffffff90);
  (**(code **)(*local_10 + 0xe8))(local_10,&local_34,1);
  TPZFMatrix<float>::Read
            ((TPZFMatrix<float> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (TPZStream *)in_RDI,in_stack_ffffffffffffff90);
  (**(code **)(*local_10 + 0xe8))(local_10,&local_38,1);
  TPZStream::Read<float>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  TPZFMatrix<float>::Read
            ((TPZFMatrix<float> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (TPZStream *)in_RDI,in_stack_ffffffffffffff90);
  (**(code **)(*local_10 + 0xe8))(local_10,&stack0xffffffffffffffc4,1);
  (**(code **)(*local_10 + 0xe8))(local_10,&stack0xffffffffffffffc0,1);
  for (iVar3 = 0; iVar3 < in_stack_ffffffffffffffc0; iVar3 = iVar3 + 1) {
    (**(code **)(*local_10 + 0xe8))(local_10,&stack0xffffffffffffffb8,1);
    (**(code **)(*local_10 + 0xe8))(local_10,&local_4c,1);
    local_54 = local_4c;
    std::
    pair<TPZDohrSubstructCondense<float>::ENumbering,_TPZDohrSubstructCondense<float>::ENumbering>::
    pair<TPZDohrSubstructCondense<float>::ENumbering_&,_TPZDohrSubstructCondense<float>::ENumbering_&,_true>
              ((pair<TPZDohrSubstructCondense<float>::ENumbering,_TPZDohrSubstructCondense<float>::ENumbering>
                *)&stack0xffffffffffffffa4,&local_50,&local_54);
    std::
    map<std::pair<TPZDohrSubstructCondense<float>::ENumbering,_TPZDohrSubstructCondense<float>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<float>::ENumbering,_TPZDohrSubstructCondense<float>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<float>::ENumbering,_TPZDohrSubstructCondense<float>::ENumbering>,_TPZVec<int>_>_>_>
    ::operator[]((map<std::pair<TPZDohrSubstructCondense<float>::ENumbering,_TPZDohrSubstructCondense<float>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<float>::ENumbering,_TPZDohrSubstructCondense<float>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<float>::ENumbering,_TPZDohrSubstructCondense<float>::ENumbering>,_TPZVec<int>_>_>_>
                  *)CONCAT44(uVar4,in_stack_ffffffffffffffc0),
                 (key_type *)CONCAT44(iVar3,in_stack_ffffffffffffffb8));
    TPZStream::Read<int>(in_stack_ffffffffffffff80,(TPZVec<int> *)in_stack_ffffffffffffff78);
  }
  (**(code **)(*local_10 + 0xe8))(local_10,&stack0xffffffffffffffa0,1);
  if (in_stack_ffffffffffffffa0 != 0) {
    operator_new(800);
    TPZMatRed<float,_TPZFMatrix<float>_>::TPZMatRed
              ((TPZMatRed<float,_TPZFMatrix<float>_> *)CONCAT44(in_stack_ffffffffffffffd4,uVar5));
    TPZAutoPointer<TPZMatRed<float,_TPZFMatrix<float>_>_>::operator=
              ((TPZAutoPointer<TPZMatRed<float,_TPZFMatrix<float>_>_> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_RDI);
    pTVar1 = TPZAutoPointer<TPZMatRed<float,_TPZFMatrix<float>_>_>::operator->
                       ((TPZAutoPointer<TPZMatRed<float,_TPZFMatrix<float>_>_> *)&in_RDI->fF1);
    (*(pTVar1->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[6])
              (pTVar1,local_10,0);
  }
  TPZFMatrix<float>::Read
            ((TPZFMatrix<float> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (TPZStream *)in_RDI,in_stack_ffffffffffffff90);
  TPZFMatrix<float>::Read
            ((TPZFMatrix<float> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (TPZStream *)in_RDI,in_stack_ffffffffffffff90);
  TPZFMatrix<float>::Read
            ((TPZFMatrix<float> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (TPZStream *)in_RDI,in_stack_ffffffffffffff90);
  return;
}

Assistant:

void TPZDohrSubstructCondense<TVar>::Read(TPZStream &input, void *context)
{
    int a;
    SAVEABLE_SKIP_NOTE(input);
    input.Read(&a);
    if (a) {
        fMatRedComplete = new TPZMatRed<TVar, TPZFMatrix<TVar> >;
        fMatRedComplete->Read(input,0);
    }
    
    SAVEABLE_SKIP_NOTE(input);
    input.Read(&fNEquations);
    SAVEABLE_SKIP_NOTE(input);
    input.Read(&fNumInternalEquations);
    SAVEABLE_SKIP_NOTE(input);
    input.Read(&fNumExternalEquations);
    std::cout << fNEquations << " " << fNumInternalEquations << " " << fNumExternalEquations << std::endl;
    input.Read( fCoarseNodes);
    std::cout << fCoarseNodes << std::endl;
    int one(-1),two(-2),three(-3),four(-4);

    input.Read(&one);
    fPhiC.Read(input, 0);
    input.Read(&two);
    fPhiC_Weighted_Condensed.Read(input, 0);
    input.Read(&three);
    input.Read( fWeights);
    fKCi.Read(input, 0);
    input.Read(&four);
    int nc;
    input.Read(&nc);
    for (int ic=0; ic<nc; ic++) {
        int a;
        int b;
        input.Read(&a);
        input.Read(&b);
        ENumbering orig = (ENumbering)(a),dest = (ENumbering)(b);
        std::pair<ENumbering, ENumbering> p(orig,dest);
        input.Read( fPermutationsScatter[p]);
    }
    int control;
    input.Read(&control);
    if(control)
    {
        fMatRed = new TPZMatRed<TVar, TPZFMatrix<TVar> >;
        fMatRed->Read(input, 0);
    }
    fLocalLoad.Read(input, 0);
    fLocalWeightedResidual.Read(input, 0);
    fAdjustSolution.Read(input, 0);
    
    
}